

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

TProb<double> * __thiscall
libDAI::TProb<double>::operator*
          (TProb<double> *__return_storage_ptr__,TProb<double> *this,TProb<double> *q)

{
  std::vector<double,_std::allocator<double>_>::vector(&__return_storage_ptr__->_p,&this->_p);
  operator*=(__return_storage_ptr__,q);
  return __return_storage_ptr__;
}

Assistant:

TProb<T> operator* (const TProb<T> & q) const {
#ifdef DEBUG
                assert( size() == q.size() );
#endif
                TProb<T> prod( *this );
                prod *= q;
                return prod;
            }